

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

bool __thiscall
glcts::TextureBufferTextureBufferRange::checkResult
          (TextureBufferTextureBufferRange *this,FormatInfo *info,char *phase,bool transformFeedback
          )

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint *pGVar3;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  undefined4 extraout_var;
  int *piVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  TestError *this_00;
  undefined7 in_register_00000009;
  GLuint *pGVar14;
  TextureBufferTextureBufferRange *pTVar15;
  undefined4 uVar16;
  ulong uVar17;
  FormatInfo *pFVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  vector<float,_std::allocator<float>_> expected;
  stringstream expVal;
  stringstream resVal;
  long *local_3c8 [2];
  long local_3b8 [2];
  FormatInfo *local_3a8;
  undefined1 local_3a0 [92];
  float local_344;
  undefined1 local_340 [8];
  pointer local_338;
  undefined1 local_330 [8];
  string local_328 [96];
  ios_base local_2c8 [8];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [8];
  string local_1a0 [104];
  ios_base aiStack_138 [264];
  long lVar9;
  
  local_3a8 = info;
  local_3a0._72_8_ = phase;
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  pGVar3 = &this->m_tf_value_buffer_id;
  pGVar14 = &this->m_tf_size_buffer_id;
  bVar19 = (int)CONCAT71(in_register_00000009,transformFeedback) != 0;
  if (!bVar19) {
    pGVar14 = &this->m_ssbo_size_id;
    pGVar3 = &this->m_ssbo_value_id;
  }
  uVar16 = 0x90d2;
  if (bVar19) {
    uVar16 = 0x8c8e;
  }
  GVar1 = *pGVar3;
  local_3a0._64_8_ = this;
  (**(code **)(lVar9 + 0x40))(uVar16,*pGVar14);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x437);
  piVar10 = (int *)(**(code **)(lVar9 + 0xd00))(uVar16,0,4,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Error mapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x43a);
  if (*piVar10 != 1) {
    local_340 = (undefined1  [8])(*(TestContext **)(local_3a0._64_8_ + 8))->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Texture size is wrong for ",0x1a);
    uVar5 = local_3a0._72_8_;
    iVar6 = (int)(ostringstream *)&local_338;
    if ((char *)local_3a0._72_8_ == (char *)0x0) {
      std::ios::clear((int)local_338[-3] + iVar6);
    }
    else {
      sVar11 = strlen((char *)local_3a0._72_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,(char *)uVar5,sVar11)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338," phase \n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Internal Format: ",0x11);
    pcVar12 = glu::getUncompressedTextureFormatName(local_3a8->m_internal_format);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_338[-3] + iVar6);
    }
    else {
      sVar11 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,pcVar12,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Expected size:   ",0x11);
    std::ostream::operator<<((ostringstream *)&local_338,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Result size:     ",0x11);
    std::ostream::_M_insert<void_const*>((ostringstream *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_340,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_338);
    std::ios_base::~ios_base(local_2c8);
  }
  (**(code **)(lVar9 + 0x1670))(uVar16);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Error unmapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,1099);
  (**(code **)(lVar9 + 0x40))(uVar16,GVar1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x44e);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  std::__cxx11::stringstream::stringstream(local_1b8);
  GVar2 = local_3a8->m_output_type;
  local_3a0._28_4_ = uVar16;
  local_3a0._80_8_ = lVar9;
  if (GVar2 == 0x1404) {
    lVar13 = (**(code **)(lVar9 + 0xd00))(uVar16,0,local_3a8->m_ssbo_value_size,1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x475);
    pFVar18 = local_3a8;
    pTVar15 = (TextureBufferTextureBufferRange *)local_3a0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)pTVar15,(ulong)local_3a8->m_n_components,
               (allocator_type *)local_3c8);
    fillOutputData(pTVar15,(GLubyte *)local_3a0._0_8_,pFVar18);
    uVar8 = pFVar18->m_n_components;
    if (uVar8 != 0) {
      bVar19 = true;
      uVar17 = 0;
      do {
        if (*(int *)(lVar13 + uVar17 * 4) != *(int *)(local_3a0._0_8_ + uVar17 * 4)) {
          local_3c8[0] = local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,0x1af8059);
          std::__cxx11::stringbuf::str(local_328);
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          local_3c8[0] = local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,0x1af8059);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          std::ostream::operator<<(local_330,*(int *)(local_3a0._0_8_ + uVar17 * 4));
          std::ostream::operator<<(local_1a8,*(int *)(lVar13 + uVar17 * 4));
          pcVar12 = glu::getUncompressedTextureFormatName(pFVar18->m_internal_format);
          std::__cxx11::stringbuf::str();
          plVar4 = local_3c8[0];
          std::__cxx11::stringbuf::str();
          logError((TextureBufferTextureBufferRange *)local_3a0._64_8_,(char *)local_3a0._72_8_,
                   pcVar12,(GLuint)uVar17,(char *)plVar4,(char *)local_3a0._32_8_);
          pFVar18 = local_3a8;
          if ((undefined1 *)local_3a0._32_8_ != local_3a0 + 0x30) {
            operator_delete((void *)local_3a0._32_8_,(ulong)(local_3a0._48_8_ + 1));
          }
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          uVar8 = pFVar18->m_n_components;
          bVar19 = false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar8);
      goto LAB_00ce3326;
    }
  }
  else if (GVar2 == 0x1405) {
    lVar13 = (**(code **)(lVar9 + 0xd00))(uVar16,0,local_3a8->m_ssbo_value_size,1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x491);
    pFVar18 = local_3a8;
    pTVar15 = (TextureBufferTextureBufferRange *)local_3a0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar15,
               (ulong)local_3a8->m_n_components,(allocator_type *)local_3c8);
    fillOutputData(pTVar15,(GLubyte *)local_3a0._0_8_,pFVar18);
    uVar8 = pFVar18->m_n_components;
    if (uVar8 != 0) {
      bVar19 = true;
      uVar17 = 0;
      do {
        if (*(int *)(lVar13 + uVar17 * 4) != *(int *)(local_3a0._0_8_ + uVar17 * 4)) {
          local_3c8[0] = local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,0x1af8059);
          std::__cxx11::stringbuf::str(local_328);
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          local_3c8[0] = local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,0x1af8059);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)local_330);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          pcVar12 = glu::getUncompressedTextureFormatName(pFVar18->m_internal_format);
          std::__cxx11::stringbuf::str();
          plVar4 = local_3c8[0];
          std::__cxx11::stringbuf::str();
          logError((TextureBufferTextureBufferRange *)local_3a0._64_8_,(char *)local_3a0._72_8_,
                   pcVar12,(GLuint)uVar17,(char *)plVar4,(char *)local_3a0._32_8_);
          pFVar18 = local_3a8;
          if ((undefined1 *)local_3a0._32_8_ != local_3a0 + 0x30) {
            operator_delete((void *)local_3a0._32_8_,(ulong)(local_3a0._48_8_ + 1));
          }
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          uVar8 = pFVar18->m_n_components;
          bVar19 = false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar8);
      goto LAB_00ce3326;
    }
  }
  else {
    if (GVar2 != 0x1406) {
      (**(code **)(lVar9 + 0x1670))(uVar16);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error ummapping buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x4ac);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed output type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                 ,0x4ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar13 = (**(code **)(lVar9 + 0xd00))(uVar16,0,local_3a8->m_ssbo_value_size,1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x45a);
    pFVar18 = local_3a8;
    pTVar15 = (TextureBufferTextureBufferRange *)local_3a0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)pTVar15,(ulong)local_3a8->m_n_components,
               (allocator_type *)local_3c8);
    fillOutputData(pTVar15,(GLubyte *)local_3a0._0_8_,pFVar18);
    uVar8 = pFVar18->m_n_components;
    if (uVar8 != 0) {
      fVar22 = 0.0001;
      bVar19 = true;
      uVar17 = 0;
      local_344 = 0.0001;
      do {
        fVar20 = *(float *)(lVar13 + uVar17 * 4) - *(float *)(local_3a0._0_8_ + uVar17 * 4);
        fVar21 = -fVar20;
        if (-fVar20 <= fVar20) {
          fVar21 = fVar20;
        }
        if (fVar22 < fVar21) {
          local_3c8[0] = local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,0x1af8059);
          std::__cxx11::stringbuf::str(local_328);
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          local_3c8[0] = local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,0x1af8059);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          std::ostream::_M_insert<double>((double)*(float *)(local_3a0._0_8_ + uVar17 * 4));
          std::ostream::_M_insert<double>((double)*(float *)(lVar13 + uVar17 * 4));
          pcVar12 = glu::getUncompressedTextureFormatName(pFVar18->m_internal_format);
          std::__cxx11::stringbuf::str();
          plVar4 = local_3c8[0];
          std::__cxx11::stringbuf::str();
          logError((TextureBufferTextureBufferRange *)local_3a0._64_8_,(char *)local_3a0._72_8_,
                   pcVar12,(GLuint)uVar17,(char *)plVar4,(char *)local_3a0._32_8_);
          pFVar18 = local_3a8;
          if ((undefined1 *)local_3a0._32_8_ != local_3a0 + 0x30) {
            operator_delete((void *)local_3a0._32_8_,(ulong)(local_3a0._48_8_ + 1));
          }
          if (local_3c8[0] != local_3b8) {
            operator_delete(local_3c8[0],local_3b8[0] + 1);
          }
          uVar8 = pFVar18->m_n_components;
          bVar19 = false;
          fVar22 = local_344;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar8);
      goto LAB_00ce3326;
    }
  }
  bVar19 = true;
LAB_00ce3326:
  if ((_func_int **)local_3a0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ - local_3a0._0_8_);
  }
  uVar5 = local_3a0._80_8_;
  (**(code **)(local_3a0._80_8_ + 0x1670))(local_3a0._28_4_);
  dVar7 = (**(code **)(uVar5 + 0x800))();
  glu::checkError(dVar7,"Error ummapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x4b3);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  return bVar19;
}

Assistant:

bool TextureBufferTextureBufferRange::checkResult(FormatInfo& info, const char* phase, bool transformFeedback)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum bufferTarget  = GL_NONE;
	glw::GLuint bufferSizeId  = GL_NONE;
	glw::GLuint bufferValueId = GL_NONE;

	if (transformFeedback)
	{
		bufferTarget  = GL_TRANSFORM_FEEDBACK_BUFFER;
		bufferSizeId  = m_tf_size_buffer_id;
		bufferValueId = m_tf_value_buffer_id;
	}
	else
	{
		bufferTarget  = GL_SHADER_STORAGE_BUFFER;
		bufferSizeId  = m_ssbo_size_id;
		bufferValueId = m_ssbo_value_id;
	}

	bool testResult = true;

	/* Get result data */
	gl.bindBuffer(bufferTarget, bufferSizeId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	glw::GLint* size = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, sizeof(glw::GLint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

	const glw::GLint expectedSize = 1;

	/* Reagrding test specification size should be equal 1*/
	/* Log error if expected and result data are not equal */
	if (*size != expectedSize)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size is wrong for " << phase << " phase \n"
						   << "Internal Format: " << glu::getUncompressedTextureFormatName(info.get_internal_format())
						   << "\n"
						   << "Expected size:   " << expectedSize << "\n"
						   << "Result size:     " << size << "\n"
						   << tcu::TestLog::EndMessage;
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer!");

	gl.bindBuffer(bufferTarget, bufferValueId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	std::stringstream expVal;
	std::stringstream resVal;

	/* Log error if expected and result data are not equal */
	switch (info.get_output_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* res =
			(glw::GLfloat*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLfloat> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (de::abs(res[i] - expected[i]) > m_epsilon_float)
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_INT:
	{
		glw::GLint* res = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_UNSIGNED_INT:
	{
		glw::GLuint* res =
			(glw::GLuint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLuint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	default:
	{
		gl.unmapBuffer(bufferTarget);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

		TCU_FAIL("Not allowed output type");
	}
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

	return testResult;
}